

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmdate.h
# Opt level: O3

int32_t __thiscall caldate_t::dayno(caldate_t *this)

{
  div_t dVar1;
  int iVar2;
  int iVar3;
  long __numer;
  ldiv_t lVar4;
  ldiv_t lVar5;
  ldiv_t lVar6;
  
  dVar1 = div(this->m + -3,0xc);
  iVar2 = dVar1.rem;
  iVar3 = iVar2 + 0xc;
  if (-1 < (long)dVar1) {
    iVar3 = iVar2;
  }
  iVar2 = this->y + dVar1.quot + (iVar2 >> 0x1f);
  __numer = (long)iVar2;
  lVar4 = ldiv(__numer,4);
  lVar5 = ldiv(__numer,100);
  lVar6 = ldiv(__numer,400);
  return (lVar6.rem._4_4_ >> 0x1f) + (int)lVar6.quot +
         iVar2 * 0x16d + this->d +
         (-(int)lVar5.quot - (lVar5.rem._4_4_ >> 0x1f)) +
         (lVar4.rem._4_4_ >> 0x1f) + (int)lVar4.quot + (iVar3 * 0x132 + 5) / 10 + -1;
}

Assistant:

int32_t dayno() const
    {
        /* 
         *   Adjust the month to our odd range where the year starts in
         *   March: 0 = March, 1 = April, ... 11 = Feb.  (If this yields a
         *   negative remainder, adjust to a positive index by going back a
         *   year.)
         */
        div_t mq = div(this->m - 3, 12);
        if (mq.rem < 0)
            mq.rem += 12, mq.quot -= 1;

        int m = mq.rem;
        int y = this->y + mq.quot;
        return 365*y + divfl(y, 4) - divfl(y, 100) + divfl(y, 400)
            + (m*306 + 5)/10 + (d-1);
    }